

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIsoFast.c
# Opt level: O2

Iso_Sto_t * Iso_StoStart(Aig_Man_t *pAig)

{
  Iso_Sto_t *pIVar1;
  Iso_Dat_t *pIVar2;
  Vec_Int_t *pVVar3;
  Vec_Ptr_t *pVVar4;
  int *piVar5;
  int iVar6;
  size_t __nmemb;
  
  pIVar1 = (Iso_Sto_t *)calloc(1,0x38);
  pIVar1->pAig = pAig;
  iVar6 = pAig->vObjs->nSize;
  __nmemb = (size_t)iVar6;
  pIVar1->nObjs = iVar6;
  pIVar2 = (Iso_Dat_t *)calloc(__nmemb,4);
  pIVar1->pData = pIVar2;
  iVar6 = (int)__nmemb;
  pVVar3 = Vec_IntStart(iVar6);
  pIVar1->vVisited = pVVar3;
  pVVar3 = Vec_IntStart(iVar6);
  pIVar1->vPlaces = pVVar3;
  pVVar4 = Vec_PtrAlloc(1000);
  pVVar4->nSize = 1000;
  memset(pVVar4->pArray,0,8000);
  pIVar1->vRoots = pVVar4;
  piVar5 = (int *)calloc(0x10000,4);
  pIVar1->pCounters = piVar5;
  return pIVar1;
}

Assistant:

Iso_Sto_t * Iso_StoStart( Aig_Man_t * pAig )
{
    Iso_Sto_t * p;
    p = ABC_CALLOC( Iso_Sto_t, 1 );
    p->pAig      = pAig;
    p->nObjs     = Aig_ManObjNumMax( pAig );
    p->pData     = ABC_CALLOC( Iso_Dat_t, p->nObjs );
    p->vVisited  = Vec_IntStart( 1000 );
    p->vPlaces   = Vec_IntStart( 1000 );
    p->vRoots    = Vec_PtrStart( 1000 );
    p->pCounters = ABC_CALLOC( int, (1 << AIG_ISO_NUM) );
    return p;
}